

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_tests.cpp
# Opt level: O2

void __thiscall mempool_tests::MempoolRemoveTest::test_method(MempoolRemoveTest *this)

{
  vector<CTxOut,_std::allocator<CTxOut>_> *this_00;
  long lVar1;
  pointer pCVar2;
  undefined8 *puVar3;
  CTxMemPool *this_01;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar4;
  CScript *pCVar5;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar6;
  unsigned_long uVar7;
  long lVar8;
  iterator pvVar9;
  iterator pvVar10;
  unsigned_long *puVar11;
  CMutableTransaction *this_02;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  int local_3b4;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  unsigned_long local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  uint poolSize;
  CMutableTransaction txParent;
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined1 local_2a8 [24];
  pointer pCStack_290;
  CMutableTransaction txGrandChild [3];
  CMutableTransaction txChild [3];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  CMutableTransaction::CMutableTransaction(&txParent);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&txParent.vin,1);
  local_2a8._16_8_ = 0;
  pCStack_290 = (pointer)0x0;
  local_2a8._0_8_ = (char *)0x0;
  local_2a8._8_8_ = 0;
  ppVar4 = &CScript::operator<<((CScript *)local_2a8,OP_11)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txParent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar4);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txParent.vout,3);
  for (lVar8 = 8; lVar8 != 0x80; lVar8 = lVar8 + 0x28) {
    local_2a8._16_8_ = 0;
    pCStack_290 = (pointer)0x0;
    local_2a8._0_8_ = (char *)0x0;
    local_2a8._8_8_ = 0;
    pCVar5 = CScript::operator<<((CScript *)local_2a8,OP_11);
    ppVar4 = &CScript::operator<<(pCVar5,OP_EQUAL)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&(txParent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue + lVar8),ppVar4);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8);
    *(undefined8 *)
     ((long)txParent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start + lVar8 + -8) = 33000;
  }
  lVar8 = 0;
  do {
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar8));
    lVar8 = lVar8 + 0x38;
  } while (lVar8 != 0xa8);
  this_02 = txChild;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&this_02->vin,1);
    local_2a8._16_8_ = 0;
    pCStack_290 = (pointer)0x0;
    local_2a8._0_8_ = (char *)0x0;
    local_2a8._8_8_ = 0;
    ppVar4 = &CScript::operator<<((CScript *)local_2a8,OP_11)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(((this_02->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar4);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8);
    CMutableTransaction::GetHash((Txid *)local_2a8,&txParent);
    pCVar2 = (this_02->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&(pCVar2->prevout).hash + 0x10) = local_2a8._16_8_;
    *(pointer *)((long)&(pCVar2->prevout).hash + 0x18) = pCStack_290;
    *(undefined8 *)&(pCVar2->prevout).hash = local_2a8._0_8_;
    *(undefined8 *)((long)&(pCVar2->prevout).hash + 8) = local_2a8._8_8_;
    (((this_02->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).n = (uint32_t)lVar8;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&this_02->vout,1);
    local_2a8._16_8_ = 0;
    pCStack_290 = (pointer)0x0;
    local_2a8._0_8_ = (char *)0x0;
    local_2a8._8_8_ = 0;
    pCVar5 = CScript::operator<<((CScript *)local_2a8,OP_11);
    ppVar4 = &CScript::operator<<(pCVar5,OP_EQUAL)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(((this_02->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar4);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8);
    ((this_02->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
     super__Vector_impl_data._M_start)->nValue = 11000;
    this_02 = this_02 + 1;
  }
  lVar8 = 0;
  do {
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar8));
    lVar8 = lVar8 + 0x38;
  } while (lVar8 != 0xa8);
  for (lVar8 = 0; lVar8 != 0xa8; lVar8 = lVar8 + 0x38) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               ((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar8),1);
    local_2a8._16_8_ = 0;
    pCStack_290 = (pointer)0x0;
    local_2a8._0_8_ = (char *)0x0;
    local_2a8._8_8_ = 0;
    ppVar4 = &CScript::operator<<((CScript *)local_2a8,OP_11)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               (*(long *)((long)&txGrandChild[0].vin.
                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar8) + 0x28),ppVar4);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8);
    CMutableTransaction::GetHash
              ((Txid *)local_2a8,
               (CMutableTransaction *)
               ((long)&txChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar8));
    puVar3 = *(undefined8 **)
              ((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar8);
    puVar3[2] = local_2a8._16_8_;
    puVar3[3] = pCStack_290;
    *puVar3 = local_2a8._0_8_;
    puVar3[1] = local_2a8._8_8_;
    *(undefined4 *)
     (*(long *)((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar8) + 0x20) = 0;
    this_00 = (vector<CTxOut,_std::allocator<CTxOut>_> *)
              ((long)&txGrandChild[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar8);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(this_00,1);
    local_2a8._16_8_ = 0;
    pCStack_290 = (pointer)0x0;
    local_2a8._0_8_ = (char *)0x0;
    local_2a8._8_8_ = 0;
    pCVar5 = CScript::operator<<((CScript *)local_2a8,OP_11);
    ppVar4 = &CScript::operator<<(pCVar5,OP_EQUAL)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(((this_00->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar4);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2a8);
    **(undefined8 **)
      ((long)&txGrandChild[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start + lVar8) = 11000;
  }
  puVar6 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                     (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.mempool,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                      ,0x42,"test_method","m_node.mempool");
  this_01 = (puVar6->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
             ,0x43,false);
  pvVar9 = (iterator)0x43;
  pvVar10 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&this_01->cs,"testPool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
             ,0x43,false);
  uVar7 = CTxMemPool::size(this_01);
  poolSize = (uint)uVar7;
  CTransaction::CTransaction((CTransaction *)local_2a8,&txParent);
  CTxMemPool::removeRecursive(this_01,(CTransaction *)local_2a8,REPLACED);
  CTransaction::~CTransaction((CTransaction *)local_2a8);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x48;
  file.m_begin = (iterator)&local_358;
  msg.m_end = pvVar10;
  msg.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_368,msg);
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pCStack_290 = (pointer)0xc7f1cc;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_370 = "";
  local_380 = CTxMemPool::size(this_01);
  puVar11 = &local_380;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_2a8,&local_378,0x48,1,2,puVar11,"testPool.size()",&poolSize,"poolSize");
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_2a8,&entry,&txParent);
  CTxMemPool::addUnchecked(this_01,(CTxMemPoolEntry *)local_2a8);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_2a8);
  uVar7 = CTxMemPool::size(this_01);
  poolSize = (uint)uVar7;
  CTransaction::CTransaction((CTransaction *)local_2a8,&txParent);
  CTxMemPool::removeRecursive(this_01,(CTransaction *)local_2a8,REPLACED);
  CTransaction::~CTransaction((CTransaction *)local_2a8);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4e;
  file_00.m_begin = (iterator)&local_390;
  msg_00.m_end = (iterator)puVar11;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3a0,
             msg_00);
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pCStack_290 = (pointer)0xc7f1cc;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3a8 = "";
  local_380 = CTxMemPool::size(this_01);
  puVar11 = &local_380;
  local_3b4 = poolSize - 1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_2a8,&local_3b0,0x4e,1,2,puVar11,"testPool.size()",&local_3b4,"poolSize - 1");
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_2a8,&entry,&txParent);
  CTxMemPool::addUnchecked(this_01,(CTxMemPoolEntry *)local_2a8);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_2a8);
  for (lVar8 = 0; lVar8 != 0xa8; lVar8 = lVar8 + 0x38) {
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_2a8,&entry,
               (CMutableTransaction *)
               ((long)&txChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar8));
    CTxMemPool::addUnchecked(this_01,(CTxMemPoolEntry *)local_2a8);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_2a8);
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_2a8,&entry,
               (CMutableTransaction *)
               ((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar8));
    CTxMemPool::addUnchecked(this_01,(CTxMemPoolEntry *)local_2a8);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_2a8);
  }
  uVar7 = CTxMemPool::size(this_01);
  poolSize = (uint)uVar7;
  CTransaction::CTransaction((CTransaction *)local_2a8,txChild);
  CTxMemPool::removeRecursive(this_01,(CTransaction *)local_2a8,REPLACED);
  CTransaction::~CTransaction((CTransaction *)local_2a8);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5a;
  file_01.m_begin = (iterator)&local_3c8;
  msg_01.m_end = (iterator)puVar11;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3d8,
             msg_01);
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pCStack_290 = (pointer)0xc7f1cc;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3e0 = "";
  local_380 = CTxMemPool::size(this_01);
  puVar11 = &local_380;
  local_3b4 = poolSize - 2;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_2a8,&local_3e8,0x5a,1,2,puVar11,"testPool.size()",&local_3b4,"poolSize - 2");
  uVar7 = CTxMemPool::size(this_01);
  poolSize = (uint)uVar7;
  CTransaction::CTransaction((CTransaction *)local_2a8,txGrandChild);
  CTxMemPool::removeRecursive(this_01,(CTransaction *)local_2a8,REPLACED);
  CTransaction::~CTransaction((CTransaction *)local_2a8);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5e;
  file_02.m_begin = (iterator)&local_3f8;
  msg_02.m_end = (iterator)puVar11;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_408,
             msg_02);
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pCStack_290 = (pointer)0xc7f1cc;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_410 = "";
  local_380 = CTxMemPool::size(this_01);
  puVar11 = &local_380;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_2a8,&local_418,0x5e,1,2,puVar11,"testPool.size()",&poolSize,"poolSize");
  uVar7 = CTxMemPool::size(this_01);
  poolSize = (uint)uVar7;
  CTransaction::CTransaction((CTransaction *)local_2a8,txChild);
  CTxMemPool::removeRecursive(this_01,(CTransaction *)local_2a8,REPLACED);
  CTransaction::~CTransaction((CTransaction *)local_2a8);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x61;
  file_03.m_begin = (iterator)&local_428;
  msg_03.m_end = (iterator)puVar11;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_438,
             msg_03);
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pCStack_290 = (pointer)0xc7f1cc;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_440 = "";
  local_380 = CTxMemPool::size(this_01);
  puVar11 = &local_380;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_2a8,&local_448,0x61,1,2,puVar11,"testPool.size()",&poolSize,"poolSize");
  uVar7 = CTxMemPool::size(this_01);
  poolSize = (uint)uVar7;
  CTransaction::CTransaction((CTransaction *)local_2a8,&txParent);
  CTxMemPool::removeRecursive(this_01,(CTransaction *)local_2a8,REPLACED);
  CTransaction::~CTransaction((CTransaction *)local_2a8);
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x65;
  file_04.m_begin = (iterator)&local_458;
  msg_04.m_end = (iterator)puVar11;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_468,
             msg_04);
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pCStack_290 = (pointer)0xc7f1cc;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_470 = "";
  local_380 = CTxMemPool::size(this_01);
  puVar11 = &local_380;
  local_3b4 = poolSize - 5;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_2a8,&local_478,0x65,1,2,puVar11,"testPool.size()",&local_3b4,"poolSize - 5");
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x66;
  file_05.m_begin = (iterator)&local_488;
  msg_05.m_end = (iterator)puVar11;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_498,
             msg_05);
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pCStack_290 = (pointer)0xc7f1cc;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4a0 = "";
  local_380 = CTxMemPool::size(this_01);
  puVar11 = &local_380;
  local_3b4 = 0;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_2a8,&local_4a8,0x66,1,2,puVar11,"testPool.size()",&local_3b4,"0U");
  for (lVar8 = 0; lVar8 != 0xa8; lVar8 = lVar8 + 0x38) {
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_2a8,&entry,
               (CMutableTransaction *)
               ((long)&txChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar8));
    CTxMemPool::addUnchecked(this_01,(CTxMemPoolEntry *)local_2a8);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_2a8);
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_2a8,&entry,
               (CMutableTransaction *)
               ((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar8));
    CTxMemPool::addUnchecked(this_01,(CTxMemPoolEntry *)local_2a8);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_2a8);
  }
  uVar7 = CTxMemPool::size(this_01);
  poolSize = (uint)uVar7;
  CTransaction::CTransaction((CTransaction *)local_2a8,&txParent);
  CTxMemPool::removeRecursive(this_01,(CTransaction *)local_2a8,REPLACED);
  CTransaction::~CTransaction((CTransaction *)local_2a8);
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x72;
  file_06.m_begin = (iterator)&local_4b8;
  msg_06.m_end = (iterator)puVar11;
  msg_06.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4c8,
             msg_06);
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pCStack_290 = (pointer)0xc7f1cc;
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4d0 = "";
  local_380 = CTxMemPool::size(this_01);
  puVar11 = &local_380;
  local_3b4 = poolSize - 6;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_2a8,&local_4d8,0x72,1,2,puVar11,"testPool.size()",&local_3b4,"poolSize - 6");
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x73;
  file_07.m_begin = (iterator)&local_4e8;
  msg_07.m_end = (iterator)puVar11;
  msg_07.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4f8,
             msg_07);
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pCStack_290 = (pointer)0xc7f1cc;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_500 = "";
  local_380 = CTxMemPool::size(this_01);
  local_3b4 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_2a8,&local_508,0x73,1,2,&local_380,"testPool.size()",&local_3b4,"0U");
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  lVar8 = 0x70;
  do {
    CMutableTransaction::~CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txGrandChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar8));
    lVar8 = lVar8 + -0x38;
  } while (lVar8 != -0x38);
  lVar8 = 0x70;
  do {
    CMutableTransaction::~CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txChild[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar8));
    lVar8 = lVar8 + -0x38;
  } while (lVar8 != -0x38);
  CMutableTransaction::~CMutableTransaction(&txParent);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(MempoolRemoveTest)
{
    // Test CTxMemPool::remove functionality

    TestMemPoolEntryHelper entry;
    // Parent transaction with three children,
    // and three grand-children:
    CMutableTransaction txParent;
    txParent.vin.resize(1);
    txParent.vin[0].scriptSig = CScript() << OP_11;
    txParent.vout.resize(3);
    for (int i = 0; i < 3; i++)
    {
        txParent.vout[i].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        txParent.vout[i].nValue = 33000LL;
    }
    CMutableTransaction txChild[3];
    for (int i = 0; i < 3; i++)
    {
        txChild[i].vin.resize(1);
        txChild[i].vin[0].scriptSig = CScript() << OP_11;
        txChild[i].vin[0].prevout.hash = txParent.GetHash();
        txChild[i].vin[0].prevout.n = i;
        txChild[i].vout.resize(1);
        txChild[i].vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        txChild[i].vout[0].nValue = 11000LL;
    }
    CMutableTransaction txGrandChild[3];
    for (int i = 0; i < 3; i++)
    {
        txGrandChild[i].vin.resize(1);
        txGrandChild[i].vin[0].scriptSig = CScript() << OP_11;
        txGrandChild[i].vin[0].prevout.hash = txChild[i].GetHash();
        txGrandChild[i].vin[0].prevout.n = 0;
        txGrandChild[i].vout.resize(1);
        txGrandChild[i].vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        txGrandChild[i].vout[0].nValue = 11000LL;
    }


    CTxMemPool& testPool = *Assert(m_node.mempool);
    LOCK2(::cs_main, testPool.cs);

    // Nothing in pool, remove should do nothing:
    unsigned int poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize);

    // Just the parent:
    testPool.addUnchecked(entry.FromTx(txParent));
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 1);

    // Parent, children, grandchildren:
    testPool.addUnchecked(entry.FromTx(txParent));
    for (int i = 0; i < 3; i++)
    {
        testPool.addUnchecked(entry.FromTx(txChild[i]));
        testPool.addUnchecked(entry.FromTx(txGrandChild[i]));
    }
    // Remove Child[0], GrandChild[0] should be removed:
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txChild[0]), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 2);
    // ... make sure grandchild and child are gone:
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txGrandChild[0]), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize);
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txChild[0]), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize);
    // Remove parent, all children/grandchildren should go:
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 5);
    BOOST_CHECK_EQUAL(testPool.size(), 0U);

    // Add children and grandchildren, but NOT the parent (simulate the parent being in a block)
    for (int i = 0; i < 3; i++)
    {
        testPool.addUnchecked(entry.FromTx(txChild[i]));
        testPool.addUnchecked(entry.FromTx(txGrandChild[i]));
    }
    // Now remove the parent, as might happen if a block-re-org occurs but the parent cannot be
    // put into the mempool (maybe because it is non-standard):
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 6);
    BOOST_CHECK_EQUAL(testPool.size(), 0U);
}